

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params *params,unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  if ((((0xffffffe9 < (params->cParams).windowLog - 0x20) &&
       (0xffffffe6 < (params->cParams).chainLog - 0x1f)) &&
      (0xffffffe6 < (params->cParams).hashLog - 0x1f)) &&
     (((0xffffffe1 < (params->cParams).searchLog - 0x1f && ((params->cParams).minMatch - 3 < 5)) &&
      (((params->cParams).targetLength < 0x20001 && ((params->cParams).strategy - ZSTD_fast < 9)))))
     ) {
    memcpy(&zcs->requestedParams,params,0x90);
    if (cdict != (ZSTD_CDict *)0x0 && dict != (void *)0x0) {
      __assert_fail("!((dict) && (cdict))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3897,
                    "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
                   );
    }
    if (dict == (void *)0x0) {
      ZSTD_clearAllDicts(zcs);
      zcs->cdict = cdict;
    }
    else {
      sVar1 = ZSTD_CCtx_loadDictionary_advanced(zcs,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
      if (0xffffffffffffff88 < sVar1) {
        return sVar1;
      }
    }
    return 0;
  }
  __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x3895,
                "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
               );
}

Assistant:

size_t ZSTD_CCtx_reset(ZSTD_CCtx* cctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong);
        ZSTD_clearAllDicts(cctx);
        return ZSTD_CCtxParams_reset(&cctx->requestedParams);
    }
    return 0;
}